

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  byte *pbVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  WhereTerm *pWVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined6 in_register_00000012;
  uint uVar11;
  ulong uVar12;
  WhereTerm *pWVar13;
  int k;
  ulong local_38;
  
  local_38 = CONCAT62(in_register_00000012,nRow);
  if (pWC->nBase < 1) {
    uVar11 = 0;
  }
  else {
    uVar3 = pLoop->maskSelf;
    uVar4 = pLoop->prereq;
    pWVar13 = pWC->a;
    uVar11 = 0;
    iVar10 = pWC->nBase;
    do {
      uVar5 = pWVar13->prereqAll;
      if ((((uVar5 & ~(uVar3 | uVar4)) == 0) && ((pLoop->maskSelf & uVar5) != 0)) &&
         ((pWVar13->wtFlags & 2) == 0)) {
        uVar2 = pLoop->nLTerm;
        uVar12 = (ulong)uVar2;
        if (uVar2 != 0) {
          uVar12 = (ulong)uVar2;
          do {
            pWVar6 = pLoop->aLTerm[uVar12 - 1];
            if ((pWVar6 != (WhereTerm *)0x0) &&
               ((pWVar6 == pWVar13 ||
                ((-1 < (long)pWVar6->iParent && (pWC->a + pWVar6->iParent == pWVar13))))))
            goto LAB_001a63a3;
            bVar7 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar7);
          uVar12 = 0;
        }
LAB_001a63a3:
        if ((int)uVar12 < 1) {
          if ((pLoop->maskSelf == uVar5) &&
             (((pWVar13->eOperator & 0x3f) != 0 ||
              ((pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype & 0x48) == 0)))) {
            pbVar1 = (byte *)((long)&pLoop->wsFlags + 2);
            *pbVar1 = *pbVar1 | 0x80;
          }
          if (pWVar13->truthProb < 1) {
            pLoop->nOut = pLoop->nOut + pWVar13->truthProb;
          }
          else {
            pLoop->nOut = pLoop->nOut + -1;
            if ((pWVar13->eOperator & 0x82) != 0) {
              local_38 = local_38 << 0x20;
              iVar8 = sqlite3ExprIsInteger(pWVar13->pExpr->pRight,(int *)&local_38);
              uVar9 = 0x14;
              if ((int)local_38 + 1U < 3) {
                uVar9 = 10;
              }
              if (iVar8 == 0) {
                uVar9 = 0x14;
              }
              local_38 = local_38 >> 0x20;
              if (uVar11 < uVar9) {
                pbVar1 = (byte *)((long)&pWVar13->wtFlags + 1);
                *pbVar1 = *pbVar1 | 0x20;
                uVar11 = uVar9;
              }
            }
          }
        }
      }
      pWVar13 = pWVar13 + 1;
      bVar7 = 1 < iVar10;
      iVar10 = iVar10 + -1;
    } while (bVar7);
  }
  iVar10 = (int)(short)local_38 - uVar11;
  if (iVar10 < pLoop->nOut) {
    pLoop->nOut = (LogEst)iVar10;
  }
  return;
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nBase, pTerm=pWC->a; i>0; i--, pTerm++){
    assert( pTerm!=0 );
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pLoop->maskSelf==pTerm->prereqAll ){
        /* If there are extra terms in the WHERE clause not used by an index
        ** that depend only on the table being scanned, and that will tend to
        ** cause many rows to be omitted, then mark that table as
        ** "self-culling".
        **
        ** 2022-03-24:  Self-culling only applies if either the extra terms
        ** are straight comparison operators that are non-true with NULL
        ** operand, or if the loop is not an OUTER JOIN.
        */
        if( (pTerm->eOperator & 0x3f)!=0
         || (pWC->pWInfo->pTabList->a[pLoop->iTab].fg.jointype
                  & (JT_LEFT|JT_LTORJ))==0
        ){
          pLoop->wsFlags |= WHERE_SELFCULL;
        }
      }
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0
         && (pTerm->wtFlags & TERM_HIGHTRUTH)==0  /* tag-20200224-1 */
        ){
          Expr *pRight = pTerm->pExpr->pRight;
          int k = 0;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ){
            pTerm->wtFlags |= TERM_HEURTRUTH;
            iReduce = k;
          }
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce ){
    pLoop->nOut = nRow - iReduce;
  }
}